

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extent_dalloc_gap(tsdn_t *tsdn,arena_t *arena,extent_t *extent)

{
  _Bool _Var1;
  undefined1 in_R9B;
  extent_hooks_t *extent_hooks;
  extent_hooks_t *local_20;
  
  local_20 = (extent_hooks_t *)0x0;
  _Var1 = extent_register_impl(tsdn,extent,SUB81(extent,0));
  if (_Var1) {
    extents_leak(tsdn,arena,&local_20,(extents_t *)(ulong)(arena->extents_retained).state,extent,
                 (_Bool)in_R9B);
  }
  else {
    extent_dalloc_wrapper(tsdn,arena,&local_20,extent);
  }
  return;
}

Assistant:

void
extent_dalloc_gap(tsdn_t *tsdn, arena_t *arena, extent_t *extent) {
	extent_hooks_t *extent_hooks = EXTENT_HOOKS_INITIALIZER;

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (extent_register(tsdn, extent)) {
		extents_leak(tsdn, arena, &extent_hooks,
		    &arena->extents_retained, extent, false);
		return;
	}
	extent_dalloc_wrapper(tsdn, arena, &extent_hooks, extent);
}